

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

Statement * rsg::anon_unknown_0::createStatement(GeneratorState *state)

{
  undefined **ppuVar1;
  Statement *pSVar2;
  int ndx;
  long lVar3;
  undefined **ppuVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float weights [4];
  float local_38 [6];
  
  fVar7 = 0.0;
  pfVar5 = local_38;
  ppuVar4 = &(anonymous_namespace)::chooseStatement(rsg::GeneratorState&)::statementSpecs;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    fVar6 = (float)(**(code **)((long)&(anonymous_namespace)::chooseStatement(rsg::GeneratorState&)
                                       ::statementSpecs + lVar3))(state);
    *pfVar5 = fVar6;
    fVar7 = fVar7 + fVar6;
    pfVar5 = pfVar5 + 1;
  }
  fVar6 = deRandom_getFloat(&state->m_random->m_rnd);
  fVar8 = 0.0;
  ppuVar1 = (undefined **)0x0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    fVar8 = fVar8 + local_38[lVar3];
    if (fVar7 * fVar6 + 0.0 < fVar8) goto LAB_00539184;
    if (0.0 < local_38[lVar3]) {
      ppuVar1 = ppuVar4;
    }
    ppuVar4 = ppuVar4 + 2;
  }
  ppuVar4 = (undefined **)0x0;
LAB_00539184:
  if (ppuVar4 != (undefined **)0x0) {
    ppuVar1 = ppuVar4;
  }
  pSVar2 = (Statement *)(*(code *)ppuVar1[1])(state);
  return pSVar2;
}

Assistant:

Statement* createStatement (GeneratorState& state)
{
	return chooseStatement(state)->create(state);
}